

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastCharAt
          (Lowerer *this,BuiltinFunction index,Opnd *dst,Opnd *srcStr,Opnd *srcIndex,
          Instr *callInstr,Instr *insertInstr,LabelInstr *labelHelper,LabelInstr *doneLabel)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  PragmaInstr *instr;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar8;
  IntConstOpnd *pIVar9;
  Lowerer *pLVar10;
  char *this_00;
  Lowerer *value;
  IndirOpnd *local_48;
  RegOpnd *local_38;
  
  pLVar10 = (Lowerer *)srcStr;
  OVar4 = IR::Opnd::GetKind(srcStr);
  if (OVar4 == OpndKindReg) {
    OVar4 = IR::Opnd::GetKind(srcStr);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_005e1432;
      *puVar6 = 0;
    }
    pLVar10 = (Lowerer *)srcStr;
    bVar5 = IR::Opnd::IsTaggedInt(srcStr);
    if (!bVar5) {
      OVar4 = IR::Opnd::GetKind(srcStr);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_005e1432;
        *puVar6 = 0;
      }
      pLVar10 = (Lowerer *)srcStr;
      bVar5 = IR::Opnd::IsNotTaggedValue(srcStr);
      goto LAB_005e0a6b;
    }
    bVar3 = true;
    bVar5 = false;
  }
  else {
    bVar5 = false;
LAB_005e0a6b:
    bVar3 = false;
  }
  pRVar7 = GetRegOpnd(pLVar10,srcStr,insertInstr,this->m_func,TyVar);
  if (bVar5 == false) {
    if (bVar3) {
      instr = IR::PragmaInstr::New(DeletedNonHelperBranch,0,this->m_func);
      IR::Instr::InsertBefore(insertInstr,&instr->super_Instr);
      InsertBranch(Br,false,labelHelper,insertInstr);
    }
    else {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar7->super_Opnd,insertInstr,labelHelper,false);
    }
  }
  OVar4 = IR::Opnd::GetKind(srcIndex);
  if (OVar4 == OpndKindAddr) {
    OVar4 = IR::Opnd::GetKind(srcIndex);
    if (OVar4 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar5) goto LAB_005e1432;
      *puVar6 = 0;
    }
    pp_Var1 = srcIndex[2]._vptr_Opnd;
    if (((ulong)pp_Var1 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pp_Var1 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_005e1432;
      *puVar6 = 0;
    }
    if (((ulong)pp_Var1 & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                         ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar5) goto LAB_005e1432;
      *puVar6 = 0;
    }
    if ((int)pp_Var1 < 0) {
      labelHelper->field_0x78 = labelHelper->field_0x78 & 0xfd;
      InsertBranch(Br,false,labelHelper,insertInstr);
      return false;
    }
  }
  GenerateStringTest(this,pRVar7,insertInstr,labelHelper,(LabelInstr *)0x0,false);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  OVar4 = IR::Opnd::GetKind(&pRVar7->super_Opnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005e1432;
    *puVar6 = 0;
  }
  pIVar8 = IR::IndirOpnd::New(pRVar7,0x10,TyUint64,this->m_func,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar8->super_Opnd,insertInstr,true);
  InsertTest(&baseOpnd->super_Opnd,&baseOpnd->super_Opnd,insertInstr);
  InsertBranch(BrEq_A,false,labelHelper,insertInstr);
  local_38 = IR::RegOpnd::New(TyUint32,this->m_func);
  pIVar8 = IR::IndirOpnd::New(pRVar7,0x18,TyUint32,this->m_func,false);
  InsertMove(&local_38->super_Opnd,&pIVar8->super_Opnd,insertInstr,true);
  OVar4 = IR::Opnd::GetKind(srcIndex);
  if (OVar4 == OpndKindAddr) {
    OVar4 = IR::Opnd::GetKind(srcIndex);
    if (OVar4 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar5) goto LAB_005e1432;
      *puVar6 = 0;
    }
    pp_Var1 = srcIndex[2]._vptr_Opnd;
    if (((ulong)pp_Var1 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pp_Var1 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_005e1432;
      *puVar6 = 0;
    }
    if (((ulong)pp_Var1 & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                         ,0x51,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar5) goto LAB_005e1432;
      *puVar6 = 0;
    }
    value = (Lowerer *)((ulong)pp_Var1 & 0xffffffff);
    pLVar10 = value;
    pIVar9 = IR::IntConstOpnd::New((IntConstType)value,TyUint32,this->m_func,false);
    InsertCompareBranch(pLVar10,&local_38->super_Opnd,&pIVar9->super_Opnd,BrLe_A,true,labelHelper,
                        insertInstr,false);
    local_48 = IR::IndirOpnd::New(baseOpnd,(int)pp_Var1 * 2,TyUint16,this->m_func,false);
    pIVar9 = IR::IntConstOpnd::New((IntConstType)value,TyUint64,this->m_func,false);
  }
  else {
    pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
    InsertMove(&pRVar7->super_Opnd,srcIndex,insertInstr,true);
    pLVar10 = this;
    pIVar9 = (IntConstOpnd *)GenerateUntagVar(this,pRVar7,labelHelper,insertInstr,true);
    InsertCompareBranch(pLVar10,&local_38->super_Opnd,(Opnd *)pIVar9,BrLe_A,true,labelHelper,
                        insertInstr,false);
    if (TySize[(pIVar9->super_Opnd).m_type] != 8) {
      pIVar9 = (IntConstOpnd *)IR::Opnd::UseWithNewType((Opnd *)pIVar9,TyUint64,this->m_func);
      OVar4 = IR::Opnd::GetKind((Opnd *)pIVar9);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_005e1432;
        *puVar6 = 0;
      }
    }
    local_48 = IR::IndirOpnd::New(baseOpnd,(RegOpnd *)pIVar9,'\x01',TyUint16,this->m_func);
  }
  if (DAT_015bbdbf == '\x01') {
    pRVar7 = IR::RegOpnd::New(TyUint64,this->m_func);
    if (TySize[(local_38->super_Opnd).m_type] != 8) {
      local_38 = (RegOpnd *)IR::Opnd::UseWithNewType(&local_38->super_Opnd,TyUint64,this->m_func);
      OVar4 = IR::Opnd::GetKind((Opnd *)local_38);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_005e1432;
        *puVar6 = 0;
      }
    }
    InsertSub(false,&pRVar7->super_Opnd,&pIVar9->super_Opnd,&local_38->super_Opnd,insertInstr);
    pIVar9 = IR::IntConstOpnd::New(0x3f,TyInt8,this->m_func,false);
    InsertShift(Shr_A,false,&pRVar7->super_Opnd,&pRVar7->super_Opnd,&pIVar9->super_Opnd,insertInstr)
    ;
    if (TySize[(pRVar7->super_Opnd).m_type] != 7) {
      pRVar7 = (RegOpnd *)IR::Opnd::UseWithNewType(&pRVar7->super_Opnd,TyUint32,this->m_func);
      OVar4 = IR::Opnd::GetKind((Opnd *)pRVar7);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_005e1432;
        *puVar6 = 0;
      }
    }
  }
  else {
    pRVar7 = (RegOpnd *)0x0;
  }
  pLVar10 = (Lowerer *)IR::RegOpnd::New(TyUint32,this->m_func);
  this_00 = (char *)pLVar10;
  InsertMove((Opnd *)pLVar10,&local_48->super_Opnd,insertInstr,true);
  if (DAT_015bbdbf == '\x01') {
    this_00 = (char *)pLVar10;
    InsertAnd((Opnd *)pLVar10,(Opnd *)pLVar10,&pRVar7->super_Opnd,insertInstr);
  }
  if (index._value == '\a') {
LAB_005e12f2:
    GenerateFastInlineStringCodePointAt
              ((Lowerer *)this_00,insertInstr,this->m_func,&local_38->super_Opnd,srcIndex,
               (RegOpnd *)pLVar10,baseOpnd);
  }
  else if (index._value != '\t') {
    if (index._value == '\b') {
      bVar5 = IR::Opnd::IsEqual(dst,srcStr);
      if (bVar5) {
        dst = &IR::RegOpnd::New(TyVar,this->m_func)->super_Opnd;
      }
      GenerateGetSingleCharString
                (this,(RegOpnd *)pLVar10,dst,labelHelper,doneLabel,insertInstr,false);
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
    ;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5476,
                       "(index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt)"
                       ,
                       "index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt"
                      );
    if (!bVar5) goto LAB_005e1432;
    *puVar6 = 0;
    if (index._value == '\a') goto LAB_005e12f2;
  }
  if (TySize[*(byte *)((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                       &(pLVar10->m_lowererMD).FloatPrefThreshold + 1)] != 8) {
    pLVar10 = (Lowerer *)IR::Opnd::UseWithNewType((Opnd *)pLVar10,TyUint64,this->m_func);
    OVar4 = IR::Opnd::GetKind((Opnd *)pLVar10);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) {
LAB_005e1432:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  LowererMD::GenerateInt32ToVarConversion(&this->m_lowererMD,(Opnd *)pLVar10,insertInstr);
  InsertMove(dst,(Opnd *)pLVar10,insertInstr,true);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastCharAt(Js::BuiltinFunction index, IR::Opnd *dst, IR::Opnd *srcStr, IR::Opnd *srcIndex, IR::Instr *callInstr,
    IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel)
{
    //  if regSrcStr is not object, JMP $helper
    //  CMP [regSrcStr + offset(type)] , static string type   -- check base string type
    //  JNE $helper
    //  MOV r1, [regSrcStr + offset(m_pszValue)]
    //  TEST r1, r1
    //  JEQ $helper
    //  MOV r2, srcIndex
    //  If r2 is not int, JMP $helper
    //  Convert r2 to int
    //  CMP [regSrcStr + offsetof(length)], r2
    //  JBE $helper
    //  MOVZX r2, [r1 + r2 * 2]
    //  if (charAt)
    //      PUSH r1
    //      PUSH scriptContext
    //      CALL GetStringFromChar
    //      MOV dst, EAX
    //  else (charCodeAt)
    //      if (codePointAt)
    //          Lowerer.GenerateFastCodePointAt -- Common inline functions
    //      Convert r2 to Var
    //      MOV dst, r2
    bool isInt = false;
    bool isNotTaggedValue = false;

    if (srcStr->IsRegOpnd())
    {
        if (srcStr->AsRegOpnd()->IsTaggedInt())
        {
            isInt = true;

        }
        else if (srcStr->AsRegOpnd()->IsNotTaggedValue())
        {
            isNotTaggedValue = true;
        }
    }

    IR::RegOpnd *regSrcStr = GetRegOpnd(srcStr, insertInstr, m_func, TyVar);

    if (!isNotTaggedValue)
    {
        if (!isInt)
        {
            m_lowererMD.GenerateObjectTest(regSrcStr, insertInstr, labelHelper);
        }
        else
        {
            // Insert delete branch opcode to tell the dbChecks not to assert on this helper label
            IR::Instr *fakeBr = IR::PragmaInstr::New(Js::OpCode::DeletedNonHelperBranch, 0, this->m_func);
            insertInstr->InsertBefore(fakeBr);

            InsertBranch(Js::OpCode::Br, labelHelper, insertInstr);
        }
    }

    // Bail out if index a constant and is less than zero.
    if (srcIndex->IsAddrOpnd() && Js::TaggedInt::ToInt32(srcIndex->AsAddrOpnd()->m_address) < 0)
    {
        labelHelper->isOpHelper = false;
        InsertBranch(Js::OpCode::Br, labelHelper, insertInstr);
        return false;
    }

    GenerateStringTest(regSrcStr, insertInstr, labelHelper, nullptr, false);

    // r1 contains the value of the char16* pointer inside JavascriptString.
    // MOV r1, [regSrcStr + offset(m_pszValue)]
    IR::RegOpnd *r1 = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(regSrcStr->AsRegOpnd(), Js::JavascriptString::GetOffsetOfpszValue(), TyMachPtr, this->m_func);
    InsertMove(r1, indirOpnd, insertInstr);

    // TEST r1, r1 -- Null pointer test
    // JEQ $helper
    InsertTestBranch(r1, r1, Js::OpCode::BrEq_A, labelHelper, insertInstr);

    IR::RegOpnd *strLength = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(strLength, IR::IndirOpnd::New(regSrcStr, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func), insertInstr);
    IR::Opnd* indexOpnd = nullptr;
    if (srcIndex->IsAddrOpnd())
    {
        uint32 indexValue = Js::TaggedInt::ToUInt32(srcIndex->AsAddrOpnd()->m_address);
        // CMP [regSrcStr + offsetof(length)], index
        // Use unsigned compare, this should handle negative indexes as well (they become > INT_MAX)
        // JBE $helper
        InsertCompareBranch(strLength, IR::IntConstOpnd::New(indexValue, TyUint32, m_func), Js::OpCode::BrLe_A, true, labelHelper, insertInstr);

        // Mask off the sign so that poisoning will work for negative indices
#if TARGET_32
        uint32 maskedIndex = CONFIG_FLAG_RELEASE(PoisonStringLoad) ? (indexValue & INT32_MAX) : indexValue;
#else
        uint32 maskedIndex = indexValue;
#endif
        indirOpnd = IR::IndirOpnd::New(r1, maskedIndex * sizeof(char16), TyUint16, this->m_func);
        indexOpnd = IR::IntConstOpnd::New(maskedIndex, TyMachPtr, m_func);
    }
    else
    {
        IR::RegOpnd *r2 = IR::RegOpnd::New(TyVar, this->m_func);
        // MOV r2, srcIndex
        InsertMove(r2, srcIndex, insertInstr);

        r2 = GenerateUntagVar(r2, labelHelper, insertInstr);

        // CMP [regSrcStr + offsetof(length)], r2
        // Use unsigned compare, this should handle negative indexes as well (they become > INT_MAX)
        // JBE $helper
        InsertCompareBranch(strLength, r2, Js::OpCode::BrLe_A, true, labelHelper, insertInstr);

#if TARGET_32
        if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
        {
            // Mask off the sign so that poisoning will work for negative indices
            InsertAnd(r2, r2, IR::IntConstOpnd::New(INT32_MAX, TyInt32, m_func), insertInstr);
        }
#endif

        if (r2->GetSize() != MachPtr)
        {
            r2 = r2->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        indexOpnd = r2;

        indirOpnd = IR::IndirOpnd::New(r1, r2, 1, TyUint16, this->m_func);
    }
    IR::RegOpnd* maskOpnd = nullptr;
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        maskOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
        if (strLength->GetSize() != MachPtr)
        {
            strLength = strLength->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        InsertSub(false, maskOpnd, indexOpnd, strLength, insertInstr);
        InsertShift(Js::OpCode::Shr_A, false, maskOpnd, maskOpnd, IR::IntConstOpnd::New(MachRegInt * 8 - 1, TyInt8, m_func), insertInstr);

        if (maskOpnd->GetSize() != TyUint32)
        {
            maskOpnd = maskOpnd->UseWithNewType(TyUint32, this->m_func)->AsRegOpnd();
        }
    }
    // MOVZX charReg, [r1 + r2 * 2]  -- this is the value of the char
    IR::RegOpnd *charReg = IR::RegOpnd::New(TyUint32, this->m_func);
    InsertMove(charReg, indirOpnd, insertInstr);
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        InsertAnd(charReg, charReg, maskOpnd, insertInstr);
    }
    if (index == Js::BuiltinFunction::JavascriptString_CharAt)
    {
        IR::Opnd *resultOpnd;
        if (dst->IsEqual(srcStr))
        {
            resultOpnd = IR::RegOpnd::New(TyVar, this->m_func);
        }
        else
        {
            resultOpnd = dst;
        }
        GenerateGetSingleCharString(charReg, resultOpnd, labelHelper, doneLabel, insertInstr, false);
    }
    else
    {
        Assert(index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt);

        if (index == Js::BuiltinFunction::JavascriptString_CodePointAt)
        {
            GenerateFastInlineStringCodePointAt(insertInstr, this->m_func, strLength, srcIndex, charReg, r1);
        }

        if (charReg->GetSize() != MachPtr)
        {
            charReg = charReg->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        m_lowererMD.GenerateInt32ToVarConversion(charReg, insertInstr);

        // MOV dst, charReg
        InsertMove(dst, charReg, insertInstr);
    }
    return true;
}